

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_candidate_index_impl.h
# Opt level: O0

void __thiscall
dh_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  reference ppVar5;
  reference this_01;
  reference __x;
  int *piVar6;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_02;
  reference piVar7;
  reference pvVar8;
  reference pvVar9;
  int local_11c;
  iterator iStack_118;
  int pre_cand_id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int intersection;
  pair<int,_int> *il_entry;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_int> *element;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *__range2;
  vector<int,_std::allocator<int>_> pre_candidates;
  pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *histogram;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *__range1;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> intersection_cnt;
  int current_tree_id;
  allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_49;
  undefined1 local_48 [8];
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  double distance_threshold_local;
  int il_size_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates_local;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *histogram_collection_local;
  CandidateIndex *this_local;
  
  il_index.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)distance_threshold;
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  allocator(&local_49);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)local_48,(long)(il_size + 1),&local_49);
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~allocator(&local_49);
  intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  sVar4 = std::
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          ::size(histogram_collection);
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,sVar4,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           ::begin(histogram_collection);
  histogram = (pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
               *)std::
                 vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 ::end(histogram_collection);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
                                *)&histogram);
    if (!bVar3) break;
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         &__gnu_cxx::
          __normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
          ::operator*(&__end1)->first;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    this_00 = (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)(pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 2);
    __end2 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::begin(this_00);
    element = (pair<const_int,_int> *)
              std::
              unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::end(this_00);
    while( true ) {
      bVar3 = std::__detail::operator!=
                        (&__end2.super__Node_iterator_base<std::pair<const_int,_int>,_false>,
                         (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&element);
      if (!bVar3) break;
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                         (&__end2);
      this_01 = std::
                vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)local_48,(long)ppVar5->first);
      __end3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (this_01);
      il_entry = (pair<int,_int> *)
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                           (this_01);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)&il_entry);
        if (!bVar3) break;
        __x = __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator*(&__end3);
        piVar6 = std::min<int>(&ppVar5->second,&__x->second);
        iVar1 = *piVar6;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)__x->first);
        if ((*pvVar9 == 0) && (iVar1 != 0)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range2,&__x->first);
        }
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)__x->first);
        *pvVar9 = iVar1 + *pvVar9;
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end3);
      }
      this_02 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                std::
                vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)local_48,(long)ppVar5->first);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                (this_02,(int *)&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar5->second);
      std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator++(&__end2);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&__range2);
    this->pre_candidates_ = sVar4 + this->pre_candidates_;
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
    iStack_118 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&__range2);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffee8);
      if (!bVar3) break;
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      local_11c = *piVar7;
      pvVar8 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](histogram_collection,
                            (long)(int)intersection_cnt.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      iVar1 = pvVar8->first;
      pvVar8 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](histogram_collection,(long)local_11c);
      iVar2 = pvVar8->first;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_78,(long)local_11c);
      if ((double)((iVar1 + iVar2 + *pvVar9 * -2) / 3) <=
          (double)il_index.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   (int *)&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_11c);
      }
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_78,(long)local_11c);
      *pvVar9 = 0;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             *)local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: histogram_collection) {
    std::vector<int> pre_candidates;
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] += intersection;
      }

      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((histogram_collection[current_tree_id].first + histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 3 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }
}